

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CLayerGroup::Render(CLayerGroup *this)

{
  IGraphics *pIVar1;
  CLayer *pCVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float aPoints [4];
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  MapScreen(this);
  pIVar1 = this->m_pMap->m_pEditor->m_pGraphics;
  if (this->m_UseClipping != 0) {
    Mapping(this->m_pMap->m_pGameGroup,&local_38);
    auVar5._0_4_ = local_30 - local_38;
    local_2c = local_2c - local_34;
    auVar4._0_4_ = (float)(this->m_ClipX + this->m_ClipW) - local_38;
    auVar4._4_4_ = (float)this->m_ClipX - local_38;
    auVar4._8_4_ = 0.0 - local_38;
    auVar4._12_4_ = 0.0 - local_38;
    auVar5._4_4_ = auVar5._0_4_;
    auVar5._8_4_ = auVar5._0_4_;
    auVar5._12_4_ = auVar5._0_4_;
    auVar4 = divps(auVar4,auVar5);
    auVar6._0_4_ = (float)(this->m_ClipY + this->m_ClipH) - local_34;
    auVar6._4_4_ = (float)this->m_ClipY - local_34;
    auVar6._8_4_ = 0.0 - local_34;
    auVar6._12_4_ = 0.0 - local_34;
    auVar7._4_4_ = local_2c;
    auVar7._0_4_ = local_2c;
    auVar7._8_4_ = local_2c;
    auVar7._12_4_ = local_2c;
    auVar7 = divps(auVar6,auVar7);
    (*(pIVar1->super_IInterface)._vptr_IInterface[3])
              (pIVar1,(ulong)(uint)(int)(auVar4._4_4_ * (float)pIVar1->m_ScreenWidth),
               (ulong)(uint)(int)(auVar7._4_4_ * (float)pIVar1->m_ScreenHeight),
               (ulong)(uint)(int)((auVar4._0_4_ - auVar4._4_4_) * (float)pIVar1->m_ScreenWidth),
               (ulong)(uint)(int)((auVar7._0_4_ - auVar7._4_4_) * (float)pIVar1->m_ScreenHeight));
  }
  if (0 < (this->m_lLayers).num_elements) {
    lVar3 = 0;
    do {
      pCVar2 = (this->m_lLayers).list[lVar3];
      if (((pCVar2->m_Visible == true) && (pCVar2 != (CLayer *)this->m_pMap->m_pGameLayer)) &&
         ((this->m_pMap->m_pEditor->m_ShowDetail != false || ((pCVar2->m_Flags & 1) == 0)))) {
        (*pCVar2->_vptr_CLayer[10])();
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->m_lLayers).num_elements);
  }
  if (this->m_UseClipping != 0) {
    (*(pIVar1->super_IInterface)._vptr_IInterface[4])(pIVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerGroup::Render()
{
	MapScreen();
	IGraphics *pGraphics = m_pMap->m_pEditor->Graphics();

	if(m_UseClipping)
	{
		float aPoints[4];
		m_pMap->m_pGameGroup->Mapping(aPoints);
		float x0 = (m_ClipX - aPoints[0]) / (aPoints[2]-aPoints[0]);
		float y0 = (m_ClipY - aPoints[1]) / (aPoints[3]-aPoints[1]);
		float x1 = ((m_ClipX+m_ClipW) - aPoints[0]) / (aPoints[2]-aPoints[0]);
		float y1 = ((m_ClipY+m_ClipH) - aPoints[1]) / (aPoints[3]-aPoints[1]);

		pGraphics->ClipEnable((int)(x0*pGraphics->ScreenWidth()), (int)(y0*pGraphics->ScreenHeight()),
			(int)((x1-x0)*pGraphics->ScreenWidth()), (int)((y1-y0)*pGraphics->ScreenHeight()));
	}

	for(int i = 0; i < m_lLayers.size(); i++)
	{
		if(m_lLayers[i]->m_Visible && m_lLayers[i] != m_pMap->m_pGameLayer)
		{
			if(m_pMap->m_pEditor->m_ShowDetail || !(m_lLayers[i]->m_Flags&LAYERFLAG_DETAIL))
				m_lLayers[i]->Render();
		}
	}

	if(m_UseClipping)
		pGraphics->ClipDisable();
}